

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

StructSchema __thiscall capnp::Schema::asStruct(Schema *this)

{
  DebugExpression<bool> _kjCondition;
  StructReader local_78;
  Fault f;
  ArrayPtr<const_char> local_38;
  WirePointer *local_28;
  int local_20;
  
  local_28 = (WirePointer *)this->raw->generic->encodedNode;
  local_38 = (ArrayPtr<const_char>)ZEXT816(0);
  local_20 = 0x7fffffff;
  _::PointerReader::getStruct(&local_78,(PointerReader *)&local_38,(word *)0x0);
  if (local_78.dataSize < 0x70) {
    _kjCondition.value = false;
  }
  else {
    _kjCondition.value = *(short *)((long)local_78.data + 0xc) == 1;
    if (_kjCondition.value) {
      return (StructSchema)(Schema)this->raw;
    }
  }
  local_28 = (WirePointer *)this->raw->generic->encodedNode;
  local_38 = (ArrayPtr<const_char>)ZEXT816(0);
  local_20 = 0x7fffffff;
  _::PointerReader::getStruct(&local_78,(PointerReader *)&local_38,(word *)0x0);
  local_28 = (WirePointer *)0x0;
  local_20 = 0x7fffffff;
  if (local_78.pointerCount != 0) {
    local_28 = local_78.pointers;
    local_20 = local_78.nestingLimit;
  }
  local_38.ptr._0_4_ = 0;
  local_38.ptr._4_4_ = 0;
  local_38.size_._0_4_ = 0;
  local_38.size_._4_4_ = 0;
  if (local_78.pointerCount != 0) {
    local_38.ptr._0_4_ = local_78.segment._0_4_;
    local_38.ptr._4_4_ = local_78.segment._4_4_;
    local_38.size_._0_4_ = local_78.capTable._0_4_;
    local_38.size_._4_4_ = local_78.capTable._4_4_;
  }
  local_38 = (ArrayPtr<const_char>)
             _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_38,(void *)0x0,0);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[44],capnp::Text::Reader>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
             ,0x11b,FAILED,"getProto().isStruct()",
             "_kjCondition,\"Tried to use non-struct schema as a struct.\", getProto().getDisplayName()"
             ,&_kjCondition,(char (*) [44])"Tried to use non-struct schema as a struct.",
             (Reader *)&local_38);
  kj::_::Debug::Fault::~Fault(&f);
  return (StructSchema)((long)_::NULL_STRUCT_SCHEMA + 0x48);
}

Assistant:

StructSchema Schema::asStruct() const {
  KJ_REQUIRE(getProto().isStruct(), "Tried to use non-struct schema as a struct.",
             getProto().getDisplayName()) {
    return StructSchema();
  }
  return StructSchema(*this);
}